

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (double *__result,double *__a,double *__b,double *__c)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  dVar7 = (double)*(int *)(__a + 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *__b;
  auVar2 = vmovhpd_avx(auVar9,*__a);
  auVar12._8_8_ = dVar7;
  auVar12._0_8_ = dVar7;
  auVar2 = vdivpd_avx(auVar2,auVar12);
  auVar10 = vshufpd_avx(auVar2,auVar2,1);
  dVar11 = auVar10._0_8_;
  dVar1 = *__c;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  if (dVar11 <= auVar2._0_8_) {
    if (dVar11 <= dVar1 / dVar7) {
      auVar8._0_8_ = (double)*(int *)(__b + 2);
      auVar2 = vunpcklpd_avx(auVar10,auVar9);
      auVar8._8_8_ = auVar8._0_8_;
      auVar2 = vdivpd_avx(auVar2,auVar8);
      auVar10 = vshufpd_avx(auVar2,auVar2,1);
      if (auVar2._0_8_ < auVar10._0_8_) goto LAB_0055f3e0;
      goto LAB_0055f400;
    }
  }
  else {
    auVar13._0_8_ = (double)*(int *)(__b + 2);
    auVar2 = vunpcklpd_avx(auVar10,auVar9);
    auVar13._8_8_ = auVar13._0_8_;
    auVar2 = vdivpd_avx(auVar2,auVar13);
    auVar10 = vshufpd_avx(auVar2,auVar2,1);
    if (auVar2._0_8_ < auVar10._0_8_) {
LAB_0055f400:
      dVar1 = *__result;
      dVar7 = __result[1];
      dVar11 = __result[2];
      dVar3 = __result[3];
      dVar4 = __b[1];
      dVar5 = __b[2];
      dVar6 = __b[3];
      *__result = *__b;
      __result[1] = dVar4;
      __result[2] = dVar5;
      __result[3] = dVar6;
      *__b = dVar1;
      __b[1] = dVar7;
      __b[2] = dVar11;
      __b[3] = dVar3;
      return;
    }
    if (dVar1 / dVar7 < dVar11) {
LAB_0055f3e0:
      dVar1 = *__result;
      dVar7 = __result[1];
      dVar11 = __result[2];
      dVar3 = __result[3];
      dVar4 = __c[1];
      dVar5 = __c[2];
      dVar6 = __c[3];
      *__result = *__c;
      __result[1] = dVar4;
      __result[2] = dVar5;
      __result[3] = dVar6;
      *__c = dVar1;
      __c[1] = dVar7;
      __c[2] = dVar11;
      __c[3] = dVar3;
      return;
    }
  }
  dVar1 = *__result;
  dVar7 = __result[1];
  dVar11 = __result[2];
  dVar3 = __result[3];
  dVar4 = __a[1];
  dVar5 = __a[2];
  dVar6 = __a[3];
  *__result = *__a;
  __result[1] = dVar4;
  __result[2] = dVar5;
  __result[3] = dVar6;
  *__a = dVar1;
  __a[1] = dVar7;
  __a[2] = dVar11;
  __a[3] = dVar3;
  return;
}

Assistant:

constexpr bool operator<(const item& other) const noexcept
        {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return (r / static_cast<Float>(factor)) <
                       (other.r / static_cast<Float>(factor));
            else
                return (other.r / static_cast<Float>(factor)) <
                       (r / static_cast<Float>(factor));
        }